

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::Convolution1D_x86_avx::create_pipeline(Convolution1D_x86_avx *this,Option *opt)

{
  uint _c;
  _func_int **pp_Var1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  int _h;
  undefined4 *puVar5;
  int i;
  ulong uVar6;
  uint uVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  undefined4 *puVar13;
  long lVar14;
  uint uVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  ulong uVar18;
  _func_int *p_Var19;
  Mat local_78;
  
  p_Var19 = this->_vptr_Convolution1D_x86_avx[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var19) == 0) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var19);
    uVar18 = (long)*(int *)(&this->field_0xf0 + (long)p_Var19) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var19);
    uVar18 = (long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
             (long)(int)_c;
    _h = (int)uVar18;
    uVar15 = 1;
    uVar7 = 1;
    if (opt->use_packing_layout == true) {
      uVar15 = (uint)((uVar18 & 3) == 0) * 3 + 1;
      if ((uVar18 & 7) == 0) {
        uVar15 = 8;
      }
      uVar7 = (uint)((_c & 3) == 0) * 3 + 1;
      if ((_c & 7) == 0) {
        uVar7 = 8;
      }
    }
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var19),
                 *(int *)(&this->field_0xd4 + (long)p_Var19),_h,_c,(Allocator *)0x0);
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                     (long)(int)uVar15),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]) /
                (int)uVar7,(ulong)(uVar7 * uVar15 * 4),uVar7 * uVar15,(Allocator *)0x0);
    uVar18 = (ulong)uVar7;
    pp_Var1 = this->_vptr_Convolution1D_x86_avx;
    p_Var19 = pp_Var1[-3];
    if ((int)uVar7 <= *(int *)(&this->field_0xd0 + (long)p_Var19)) {
      uVar11 = (ulong)uVar15;
      pvVar2 = (this->weight_data_packed).data;
      sVar3 = (this->weight_data_packed).cstep;
      sVar4 = (this->weight_data_packed).elemsize;
      uVar10 = 0;
      do {
        if ((int)uVar15 <= _h) {
          puVar5 = (undefined4 *)
                   ((long)(int)((uVar10 & 0xffffffff) / uVar18) * sVar3 * sVar4 + (long)pvVar2);
          puVar13 = (undefined4 *)
                    (local_78.cstep * local_78.elemsize * uVar10 + (long)local_78.data);
          lVar14 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var19)) {
              lVar12 = 0;
              puVar8 = puVar13;
              do {
                uVar6 = 0;
                uVar9 = uVar18;
                puVar17 = puVar8;
                puVar16 = puVar8;
                do {
                  do {
                    *puVar5 = *puVar17;
                    puVar5 = puVar5 + 1;
                    uVar9 = uVar9 - 1;
                    puVar17 = (undefined4 *)((long)puVar17 + local_78.cstep * local_78.elemsize);
                  } while (uVar9 != 0);
                  uVar6 = uVar6 + 1;
                  puVar17 = (undefined4 *)((long)puVar16 + (long)local_78.w * local_78.elemsize);
                  uVar9 = uVar18;
                  puVar16 = puVar17;
                } while (uVar6 != uVar11);
                lVar12 = lVar12 + 1;
                p_Var19 = pp_Var1[-3];
                puVar8 = puVar8 + 1;
              } while (lVar12 < *(int *)(&this->field_0xd4 + (long)p_Var19));
            }
            lVar14 = lVar14 + uVar11;
            puVar13 = (undefined4 *)((long)puVar13 + (long)local_78.w * local_78.elemsize * uVar11);
          } while (lVar14 < (long)((long)_h - (ulong)(uVar15 - 1)));
        }
        uVar10 = uVar10 + uVar18;
      } while ((long)((uVar7 - 1) + uVar10) < (long)*(int *)(&this->field_0xd0 + (long)p_Var19));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}